

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)57,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ims<2> local_54;
  int local_50;
  Imu<2> local_48;
  int local_44;
  undefined1 local_3c [8];
  Ea<(moira::Mode)3,_2> dst;
  u32 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext3._2_2_ = op;
  dst.ext2 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)3,2>((Ea<(moira::Mode)3,_2> *)local_3c,this,dst.ext3._2_2_ & 7,addr);
  if (str->style->syntax == MUSASHI) {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_44 = (str->tab).raw;
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_44);
    Imu<2>::Imu(&local_48,dst.ext2);
    pSVar1 = StrWriter::operator<<(pSVar1,local_48);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)3,_2> *)local_3c);
  }
  else {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    local_50 = (str->tab).raw;
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_50);
    Ims<2>::Ims(&local_54,dst.ext2);
    pSVar1 = StrWriter::operator<<(pSVar1,local_54);
    pSVar1 = StrWriter::operator<<(pSVar1,",");
    StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)3,_2> *)local_3c);
  }
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}